

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl.cc
# Opt level: O1

bool __thiscall
google::protobuf::io::ConcatenatingInputStream::Skip(ConcatenatingInputStream *this,int count)

{
  int iVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  ulong uVar4;
  
  uVar4 = (ulong)(uint)count;
  while (iVar3 = this->stream_count_, 0 < iVar3) {
    iVar1 = (*(*this->streams_)->_vptr_ZeroCopyInputStream[5])();
    iVar2 = (*(*this->streams_)->_vptr_ZeroCopyInputStream[4])(*this->streams_,uVar4);
    if ((char)iVar2 != '\0') break;
    iVar3 = (*(*this->streams_)->_vptr_ZeroCopyInputStream[5])();
    this->bytes_retired_ = this->bytes_retired_ + CONCAT44(extraout_var,iVar3);
    this->streams_ = this->streams_ + 1;
    this->stream_count_ = this->stream_count_ + -1;
    uVar4 = (ulong)(uint)((iVar1 + (int)uVar4) - iVar3);
  }
  return 0 < iVar3;
}

Assistant:

bool ConcatenatingInputStream::Skip(int count) {
  while (stream_count_ > 0) {
    // Assume that ByteCount() can be used to find out how much we actually
    // skipped when Skip() fails.
    int64 target_byte_count = streams_[0]->ByteCount() + count;
    if (streams_[0]->Skip(count)) return true;

    // Hit the end of the stream.  Figure out how many more bytes we still have
    // to skip.
    int64 final_byte_count = streams_[0]->ByteCount();
    GOOGLE_DCHECK_LT(final_byte_count, target_byte_count);
    count = target_byte_count - final_byte_count;

    // That stream is done.  Advance to the next one.
    bytes_retired_ += final_byte_count;
    ++streams_;
    --stream_count_;
  }

  return false;
}